

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CoreBroker.cpp
# Opt level: O3

void __thiscall helics::CoreBroker::setTimeBarrier(CoreBroker *this,Time barrierTime)

{
  ActionMessage tbarrier;
  ActionMessage local_d0;
  
  if (barrierTime.internalTimeCode == 0x7fffffffffffffff) {
    clearTimeBarrier(this);
    return;
  }
  ActionMessage::ActionMessage(&local_d0,cmd_time_barrier_request);
  local_d0.source_id.gid = (this->super_BrokerBase).global_id._M_i.gid;
  local_d0.actionTime.internalTimeCode = barrierTime.internalTimeCode;
  BrokerBase::addActionMessage(&this->super_BrokerBase,&local_d0);
  ActionMessage::~ActionMessage(&local_d0);
  return;
}

Assistant:

void CoreBroker::setTimeBarrier(Time barrierTime)
{
    if (barrierTime == Time::maxVal()) {
        return clearTimeBarrier();
    }
    ActionMessage tbarrier(CMD_TIME_BARRIER_REQUEST);
    tbarrier.source_id = global_id.load();
    tbarrier.actionTime = barrierTime;
    addActionMessage(tbarrier);
}